

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QSslCipher>::emplace<QSslCipher_const&>
          (QMovableArrayOps<QSslCipher> *this,qsizetype i,QSslCipher *args)

{
  QSslCipher **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter IStack_58;
  QSslCipher tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QSslCipher>).super_QArrayDataPointer<QSslCipher>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QSslCipher>).super_QArrayDataPointer<QSslCipher>.size == i) {
      qVar5 = QArrayDataPointer<QSslCipher>::freeSpaceAtEnd((QArrayDataPointer<QSslCipher> *)this);
      if (qVar5 == 0) goto LAB_0022b952;
      QSslCipher::QSslCipher
                ((this->super_QGenericArrayOps<QSslCipher>).super_QArrayDataPointer<QSslCipher>.ptr
                 + (this->super_QGenericArrayOps<QSslCipher>).super_QArrayDataPointer<QSslCipher>.
                   size,args);
LAB_0022ba37:
      pqVar2 = &(this->super_QGenericArrayOps<QSslCipher>).super_QArrayDataPointer<QSslCipher>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0022b9f6;
    }
LAB_0022b952:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QSslCipher>::freeSpaceAtBegin((QArrayDataPointer<QSslCipher> *)this)
      ;
      if (qVar5 != 0) {
        QSslCipher::QSslCipher
                  ((this->super_QGenericArrayOps<QSslCipher>).super_QArrayDataPointer<QSslCipher>.
                   ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QSslCipher>).super_QArrayDataPointer<QSslCipher>.
                   ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_0022ba37;
      }
    }
  }
  tmp.d._M_t.super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
  super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl =
       (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)&DAT_aaaaaaaaaaaaaaaa
  ;
  QSslCipher::QSslCipher(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QSslCipher>).super_QArrayDataPointer<QSslCipher>.size != 0;
  QArrayDataPointer<QSslCipher>::detachAndGrow
            ((QArrayDataPointer<QSslCipher> *)this,(uint)(i == 0 && bVar6),1,(QSslCipher **)0x0,
             (QArrayDataPointer<QSslCipher> *)0x0);
  if (i == 0 && bVar6) {
    QSslCipher::QSslCipher
              ((this->super_QGenericArrayOps<QSslCipher>).super_QArrayDataPointer<QSslCipher>.ptr +
               -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QSslCipher>).super_QArrayDataPointer<QSslCipher>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QSslCipher>).super_QArrayDataPointer<QSslCipher>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&IStack_58,(QArrayDataPointer<QSslCipher> *)this,i,1);
    QSslCipher::QSslCipher(IStack_58.displaceFrom,&tmp);
    IStack_58.displaceFrom = IStack_58.displaceFrom + 1;
    Inserter::~Inserter(&IStack_58);
  }
  QSslCipher::~QSslCipher(&tmp);
LAB_0022b9f6:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }